

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

OpenCLDebugInfo100Instructions __thiscall
spvtools::opt::Instruction::GetOpenCL100DebugOpcode(Instruction *this)

{
  IRContext *pIVar1;
  uint32_t uVar2;
  OpenCLDebugInfo100Instructions OVar3;
  uint uVar4;
  
  if (this->opcode_ == OpExtInst) {
    pIVar1 = this->context_;
    if ((pIVar1->feature_mgr_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
        .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
        (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(pIVar1);
    }
    if (((pIVar1->feature_mgr_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
         .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)->
        extinst_importid_OpenCL100DebugInfo_ != 0) {
      uVar2 = (this->has_result_id_ & 1) + 1;
      if (this->has_type_id_ == false) {
        uVar2 = (uint)this->has_result_id_;
      }
      uVar2 = GetSingleWordOperand(this,uVar2);
      pIVar1 = this->context_;
      if ((pIVar1->feature_mgr_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
          .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
          (FeatureManager *)0x0) {
        IRContext::AnalyzeFeatures(pIVar1);
      }
      if (uVar2 == ((pIVar1->feature_mgr_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                    .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)->
                   extinst_importid_OpenCL100DebugInfo_) {
        uVar4 = (this->has_result_id_ & 1) + 1;
        if (this->has_type_id_ == false) {
          uVar4 = (uint)this->has_result_id_;
        }
        OVar3 = GetSingleWordOperand(this,uVar4 + 1);
        return OVar3;
      }
    }
  }
  return OpenCLDebugInfo100InstructionsMax;
}

Assistant:

OpenCLDebugInfo100Instructions Instruction::GetOpenCL100DebugOpcode() const {
  if (opcode() != spv::Op::OpExtInst) {
    return OpenCLDebugInfo100InstructionsMax;
  }

  if (!context()->get_feature_mgr()->GetExtInstImportId_OpenCL100DebugInfo()) {
    return OpenCLDebugInfo100InstructionsMax;
  }

  if (GetSingleWordInOperand(kExtInstSetIdInIdx) !=
      context()->get_feature_mgr()->GetExtInstImportId_OpenCL100DebugInfo()) {
    return OpenCLDebugInfo100InstructionsMax;
  }

  return OpenCLDebugInfo100Instructions(
      GetSingleWordInOperand(kExtInstInstructionInIdx));
}